

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.hpp
# Opt level: O1

void __thiscall fw::Mesh<fw::StandardVertex3D>::destroyBuffers(Mesh<fw::StandardVertex3D> *this)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  Writer *pWVar3;
  GLuint *pGVar4;
  Writer local_90;
  
  local_90._vptr_Writer = (_func_int **)&PTR__Writer_001f9430;
  local_90.m_level = Debug;
  local_90.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Mesh.hpp"
  ;
  local_90.m_line = 0x94;
  local_90.m_func =
       "void fw::Mesh<fw::StandardVertex3D>::destroyBuffers() [VertexType = fw::StandardVertex3D]";
  local_90.m_verboseLevel = 0;
  local_90.m_logger = (Logger *)0x0;
  local_90.m_proceed = false;
  local_90.m_messageBuilder.m_logger = (Logger *)0x0;
  local_90.m_messageBuilder.m_containerLogSeperator = "";
  local_90.m_dispatchAction = NormalLog;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar3 = el::base::Writer::construct(&local_90,1,"framework");
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"Destroying buffers (vao=");
  }
  pGVar1 = &this->_vao;
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,*pGVar1);
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder," vbo=");
  }
  pGVar2 = &this->_vbo;
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,*pGVar2);
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder," ebo=");
  }
  pGVar4 = &this->_ebo;
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,*pGVar4);
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,").");
  }
  el::base::Writer::~Writer(&local_90);
  if (*pGVar2 != 0) {
    (*glad_glDeleteBuffers)(1,pGVar2);
  }
  if (*pGVar4 != 0) {
    (*glad_glDeleteBuffers)(1,pGVar4);
  }
  if (*pGVar1 != 0) {
    (*glad_glDeleteVertexArrays)(1,pGVar1);
  }
  *pGVar4 = 0;
  *pGVar2 = 0;
  *pGVar1 = 0;
  return;
}

Assistant:

void Mesh<VertexType>::destroyBuffers()
{
    LOG(DEBUG) << "Destroying buffers (vao=" << _vao << " vbo=" << _vbo
        << " ebo=" << _ebo << ").";

    if (_vbo) glDeleteBuffers(1, &_vbo);
    if (_ebo) glDeleteBuffers(1, &_ebo);
    if (_vao) glDeleteVertexArrays(1, &_vao);
    _vao = _vbo = _ebo = 0;
}